

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

void Ifn_ManSatDeriveOne(sat_solver *pSat,Vec_Int_t *vPiVars,Vec_Int_t *vValues)

{
  int iVar1;
  long lVar2;
  
  vValues->nSize = 0;
  if (0 < vPiVars->nSize) {
    lVar2 = 0;
    do {
      iVar1 = vPiVars->pArray[lVar2];
      if (((long)iVar1 < 0) || (pSat->size <= iVar1)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      Vec_IntPush(vValues,(uint)(pSat->model[iVar1] == 1));
      lVar2 = lVar2 + 1;
    } while (lVar2 < vPiVars->nSize);
  }
  return;
}

Assistant:

void Ifn_ManSatDeriveOne( sat_solver * pSat, Vec_Int_t * vPiVars, Vec_Int_t * vValues )
{
    int i, iVar;
    Vec_IntClear( vValues );
    Vec_IntForEachEntry( vPiVars, iVar, i )
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
}